

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullDevice.cpp
# Opt level: O2

void lateLoadNullDevice(void)

{
  int iVar1;
  allocator local_5a;
  allocator local_59;
  MakeFunction local_58;
  FindFunction local_50;
  string local_48;
  string local_28;
  
  if (lateLoadNullDevice()::registerNullDevice == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadNullDevice()::registerNullDevice);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_28,"null",&local_59);
      local_50 = findNullDevice;
      local_58 = makeNullDevice;
      std::__cxx11::string::string((string *)&local_48,"0.7",&local_5a);
      SoapySDR::Registry::Registry
                (&lateLoadNullDevice::registerNullDevice,&local_28,&local_50,&local_58,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_28);
      __cxa_atexit(SoapySDR::Registry::~Registry,&lateLoadNullDevice::registerNullDevice,
                   &__dso_handle);
      __cxa_guard_release(&lateLoadNullDevice()::registerNullDevice);
    }
  }
  return;
}

Assistant:

void lateLoadNullDevice(void)
{
    static SoapySDR::Registry registerNullDevice("null", &findNullDevice, &makeNullDevice, SOAPY_SDR_ABI_VERSION);
}